

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexTextureTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::Vertex2DArrayTextureCase::init
          (Vertex2DArrayTextureCase *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  RenderTarget *this_00;
  NotSupportedError *pNVar4;
  ShaderProgram *this_01;
  RenderContext *pRVar5;
  TestLog *log;
  TestError *this_02;
  Texture2DArray *this_03;
  Texture2DArray *pTVar6;
  TextureFormat *format;
  PixelBufferAccess *pPVar7;
  exception *anon_var_0;
  int i_1;
  Vector<float,_4> local_2b8;
  Vec4 local_2a8;
  RGBA local_298;
  Vector<float,_4> local_294;
  Vector<float,_4> local_284;
  Vec4 local_274;
  uint local_264;
  uint local_260;
  deUint32 colorB;
  deUint32 colorA;
  deUint32 rgb;
  deUint32 step;
  int levelNdx_1;
  Vector<float,_4> local_240;
  undefined1 local_230 [8];
  Vec4 gMax;
  Vector<float,_4> local_210;
  undefined1 local_200 [8];
  Vec4 gMin;
  int levelNdx;
  Vec4 cScale;
  Vec4 cBias;
  TextureFormatInfo fmtInfo;
  int numLevels;
  int i;
  int texLayers;
  int texHeight;
  int texWidth;
  GLint maxVertexTextures;
  allocator<char> local_149;
  string local_148;
  ProgramSources local_128;
  undefined1 local_55;
  allocator<char> local_41;
  string local_40;
  char *local_20;
  char *fragmentShaderSource;
  char *vertexShaderSource;
  Vertex2DArrayTextureCase *this_local;
  
  fragmentShaderSource =
       "#version 300 es\nin highp vec2 a_position;\nin highp vec3 a_texCoord;\nuniform highp sampler2DArray u_texture;\nuniform highp float u_lod;\nout mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureLod(u_texture, a_texCoord, u_lod);\n}\n"
  ;
  local_20 = 
  "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\tdEQP_FragColor = v_color;\n}\n"
  ;
  vertexShaderSource = (char *)this;
  this_00 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar2 = tcu::RenderTarget::getNumSamples(this_00);
  if (iVar2 != 0) {
    local_55 = 1;
    pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"MSAA config not supported by this test",&local_41);
    tcu::NotSupportedError::NotSupportedError(pNVar4,&local_40);
    local_55 = 0;
    __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError)
    ;
  }
  this_01 = (ShaderProgram *)operator_new(0xd0);
  texWidth._2_1_ = 1;
  pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_148,
             "#version 300 es\nin highp vec2 a_position;\nin highp vec3 a_texCoord;\nuniform highp sampler2DArray u_texture;\nuniform highp float u_lod;\nout mediump vec4 v_color;\n\nvoid main()\n{\n\tgl_Position = vec4(a_position, 0.0, 1.0);\n\tv_color = textureLod(u_texture, a_texCoord, u_lod);\n}\n"
             ,&local_149);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&maxVertexTextures,
             "#version 300 es\nlayout(location = 0) out mediump vec4 dEQP_FragColor;\nin mediump vec4 v_color;\n\nvoid main()\n{\n\tdEQP_FragColor = v_color;\n}\n"
             ,(allocator<char> *)((long)&texWidth + 3));
  glu::makeVtxFragSources(&local_128,&local_148,(string *)&maxVertexTextures);
  glu::ShaderProgram::ShaderProgram(this_01,pRVar5,&local_128);
  texWidth._2_1_ = 0;
  this->m_program = this_01;
  glu::ProgramSources::~ProgramSources(&local_128);
  std::__cxx11::string::~string((string *)&maxVertexTextures);
  std::allocator<char>::~allocator((allocator<char> *)((long)&texWidth + 3));
  std::__cxx11::string::~string((string *)&local_148);
  std::allocator<char>::~allocator(&local_149);
  bVar1 = glu::ShaderProgram::isOk(this->m_program);
  if (!bVar1) {
    log = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    glu::operator<<(log,this->m_program);
    glwGetIntegerv(0x8b4c,&texHeight);
    if (texHeight < 1) {
      pNVar4 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (pNVar4,"Vertex texture image units not supported","",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
                 ,0x4c2);
      __cxa_throw(pNVar4,&tcu::NotSupportedError::typeinfo,
                  tcu::NotSupportedError::~NotSupportedError);
    }
    this_02 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_02,"Failed to compile shader",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fVertexTextureTests.cpp"
               ,0x4c4);
    __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
  }
  for (fmtInfo.lookupBias.m_data[3] = 0.0; (int)fmtInfo.lookupBias.m_data[3] < 2;
      fmtInfo.lookupBias.m_data[3] = (float)((int)fmtInfo.lookupBias.m_data[3] + 1)) {
    this_03 = (Texture2DArray *)operator_new(0x70);
    pRVar5 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
    glu::Texture2DArray::Texture2DArray(this_03,pRVar5,0x1907,0x1401,0x80,0x80,8);
    this->m_textures[(int)fmtInfo.lookupBias.m_data[3]] = this_03;
  }
  iVar2 = de::max<int>(0x80,0x80);
  iVar2 = ::deLog2Floor32(iVar2);
  fmtInfo.lookupBias.m_data[2] = (float)(iVar2 + 1);
  pTVar6 = glu::Texture2DArray::getRefTexture(this->m_textures[0]);
  format = tcu::TextureLevelPyramid::getFormat(&pTVar6->super_TextureLevelPyramid);
  tcu::getTextureFormatInfo((TextureFormatInfo *)(cBias.m_data + 2),format);
  tcu::Vector<float,_4>::Vector
            ((Vector<float,_4> *)(cScale.m_data + 2),(Vector<float,_4> *)(cBias.m_data + 2));
  tcu::operator-((tcu *)(gMin.m_data + 3),(Vector<float,_4> *)(fmtInfo.valueMin.m_data + 2),
                 (Vector<float,_4> *)(cBias.m_data + 2));
  for (gMin.m_data[2] = 0.0; (int)gMin.m_data[2] < (int)fmtInfo.lookupBias.m_data[2];
      gMin.m_data[2] = (float)((int)gMin.m_data[2] + 1)) {
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(gMax.m_data + 2),-0.5,-0.5,-0.5,2.0);
    tcu::operator*((tcu *)&local_210,(Vector<float,_4> *)(gMax.m_data + 2),
                   (Vector<float,_4> *)(gMin.m_data + 3));
    tcu::operator+((tcu *)local_200,&local_210,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&step,1.0,1.0,1.0,0.0);
    tcu::operator*((tcu *)&local_240,(Vector<float,_4> *)&step,(Vector<float,_4> *)(gMin.m_data + 3)
                  );
    tcu::operator+((tcu *)local_230,&local_240,(Vector<float,_4> *)(cScale.m_data + 2));
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_textures[0]);
    tcu::Texture2DArray::allocLevel(pTVar6,(int)gMin.m_data[2]);
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_textures[0]);
    pPVar7 = tcu::TextureLevelPyramid::getLevel
                       (&pTVar6->super_TextureLevelPyramid,(int)gMin.m_data[2]);
    tcu::fillWithComponentGradients(pPVar7,(Vec4 *)local_200,(Vec4 *)local_230);
  }
  for (rgb = 0; (int)rgb < (int)fmtInfo.lookupBias.m_data[2]; rgb = rgb + 1) {
    colorA = (deUint32)(0xffffff / (long)(int)fmtInfo.lookupBias.m_data[2]);
    colorB = colorA * rgb;
    local_260 = colorB | 0xff000000;
    local_264 = ~colorB | 0xff000000;
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_textures[1]);
    tcu::Texture2DArray::allocLevel(pTVar6,rgb);
    pTVar6 = glu::Texture2DArray::getRefTexture(this->m_textures[1]);
    pPVar7 = tcu::TextureLevelPyramid::getLevel(&pTVar6->super_TextureLevelPyramid,rgb);
    tcu::RGBA::RGBA(&local_298,local_260);
    tcu::RGBA::toVec((RGBA *)&local_294);
    tcu::operator*((tcu *)&local_284,&local_294,(Vector<float,_4> *)(gMin.m_data + 3));
    tcu::operator+((tcu *)&local_274,&local_284,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::RGBA::RGBA((RGBA *)((long)&anon_var_0 + 4),local_264);
    tcu::RGBA::toVec((RGBA *)&i_1);
    tcu::operator*((tcu *)&local_2b8,(Vector<float,_4> *)&i_1,(Vector<float,_4> *)(gMin.m_data + 3))
    ;
    tcu::operator+((tcu *)&local_2a8,&local_2b8,(Vector<float,_4> *)(cScale.m_data + 2));
    tcu::fillWithGrid(pPVar7,4,&local_274,&local_2a8);
  }
  anon_var_0._0_4_ = 0;
  dVar3 = rgb;
  while ((int)(deUint32)anon_var_0 < 2) {
    glu::Texture2DArray::upload(this->m_textures[(int)(deUint32)anon_var_0]);
    dVar3 = (deUint32)anon_var_0 + 1;
    anon_var_0._0_4_ = dVar3;
  }
  return dVar3;
}

Assistant:

void Vertex2DArrayTextureCase::init (void)
{
	const char* const vertexShaderSource =
		"#version 300 es\n"
		"in highp vec2 a_position;\n"
		"in highp vec3 a_texCoord;\n"
		"uniform highp sampler2DArray u_texture;\n"
		"uniform highp float u_lod;\n"
		"out mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	gl_Position = vec4(a_position, 0.0, 1.0);\n"
		"	v_color = textureLod(u_texture, a_texCoord, u_lod);\n"
		"}\n";

	const char* const fragmentShaderSource =
		"#version 300 es\n"
		"layout(location = 0) out mediump vec4 dEQP_FragColor;\n"
		"in mediump vec4 v_color;\n"
		"\n"
		"void main()\n"
		"{\n"
		"	dEQP_FragColor = v_color;\n"
		"}\n";

	if (m_context.getRenderTarget().getNumSamples() != 0)
		throw tcu::NotSupportedError("MSAA config not supported by this test");

	// Create shader.

	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), glu::makeVtxFragSources(vertexShaderSource, fragmentShaderSource));

	if(!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;

		GLint maxVertexTextures;
		glGetIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTextures);

		if (maxVertexTextures < 1)
			throw tcu::NotSupportedError("Vertex texture image units not supported", "", __FILE__, __LINE__);
		else
			TCU_FAIL("Failed to compile shader");
	}

	// Make the textures.

	try
	{
		const int texWidth	= WIDTH_2D_ARRAY;
		const int texHeight	= HEIGHT_2D_ARRAY;
		const int texLayers	= LAYERS_2D_ARRAY;

		for (int i = 0; i < 2; i++)
		{
			DE_ASSERT(!m_textures[i]);
			m_textures[i] = new glu::Texture2DArray(m_context.getRenderContext(), GL_RGB, GL_UNSIGNED_BYTE, texWidth, texHeight, texLayers);
		}

		const int						numLevels	= deLog2Floor32(de::max(texWidth, texHeight)) + 1;
		const tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(m_textures[0]->getRefTexture().getFormat());
		const Vec4						cBias		= fmtInfo.valueMin;
		const Vec4						cScale		= fmtInfo.valueMax-fmtInfo.valueMin;

		// Fill first with gradient texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const Vec4 gMin = Vec4(-0.5f, -0.5f, -0.5f, 2.0f)*cScale + cBias;
			const Vec4 gMax = Vec4( 1.0f,  1.0f,  1.0f, 0.0f)*cScale + cBias;

			m_textures[0]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithComponentGradients(m_textures[0]->getRefTexture().getLevel(levelNdx), gMin, gMax);
		}

		// Fill second with grid texture.
		for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
		{
			const deUint32 step		= 0x00ffffff / numLevels;
			const deUint32 rgb		= step*levelNdx;
			const deUint32 colorA	= 0xff000000 | rgb;
			const deUint32 colorB	= 0xff000000 | ~rgb;

			m_textures[1]->getRefTexture().allocLevel(levelNdx);
			tcu::fillWithGrid(m_textures[1]->getRefTexture().getLevel(levelNdx), 4, tcu::RGBA(colorA).toVec()*cScale + cBias, tcu::RGBA(colorB).toVec()*cScale + cBias);
		}

		// Upload.
		for (int i = 0; i < 2; i++)
			m_textures[i]->upload();
	}
	catch (const std::exception&)
	{
		// Clean up to save memory.
		Vertex2DArrayTextureCase::deinit();
		throw;
	}
}